

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O0

int katherine_get_readout_status(katherine_device_t *device,katherine_readout_status_t *status)

{
  uint64_t *status_crd;
  char crd [8];
  int res;
  katherine_readout_status_t *status_local;
  katherine_device_t *device_local;
  
  unique0x10000090 = status;
  crd._0_4_ = katherine_cmd_get_readout_status(&device->control_socket);
  if ((crd._0_4_ == 0) &&
     (crd._0_4_ = katherine_cmd_wait_ack_crd
                            (&device->control_socket,(char *)((long)&status_crd + 4)),
     crd._0_4_ == 0)) {
    stack0xffffffffffffffe0->hw_type = (uint)(byte)stack0xffffffffffffffd4;
    stack0xffffffffffffffe0->hw_revision = (uint)(byte)((ulong)stack0xffffffffffffffd4 >> 8);
    stack0xffffffffffffffe0->hw_serial_number =
         (uint)(ushort)((ulong)stack0xffffffffffffffd4 >> 0x10);
    stack0xffffffffffffffe0->fw_version = (uint)(ushort)((ulong)stack0xffffffffffffffd4 >> 0x20);
    device_local._4_4_ = 0;
  }
  else {
    device_local._4_1_ = crd[0];
    device_local._5_1_ = crd[1];
    device_local._6_1_ = crd[2];
    device_local._7_1_ = crd[3];
  }
  return device_local._4_4_;
}

Assistant:

int
katherine_get_readout_status(katherine_device_t *device, katherine_readout_status_t *status)
{
    int res;

    res = katherine_cmd_get_readout_status(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    const uint64_t *status_crd = (const uint64_t *) &crd;
    status->hw_type             = EXTRACT(*status_crd, readout_status_crd, hw_type);
    status->hw_revision         = EXTRACT(*status_crd, readout_status_crd, hw_revision);
    status->hw_serial_number    = EXTRACT(*status_crd, readout_status_crd, hw_serial_number);
    status->fw_version          = EXTRACT(*status_crd, readout_status_crd, fw_version);

    return 0;

err:
    return res;
}